

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

bool __thiscall
CLI::App::_parse_single
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool *positional_only)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  Classifier current_type;
  HorribleError *this_00;
  string local_60;
  string local_40;
  
  if (*positional_only == false) {
    current_type = _recognize(this,(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish + -1,true);
    switch(current_type) {
    case NONE:
      goto switchD_0015ab86_caseD_0;
    case POSITIONAL_MARK:
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
      pcVar2 = pbVar1[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &pbVar1[-1].field_2) {
        operator_delete(pcVar2,pbVar1[-1].field_2._M_allocated_capacity + 1);
      }
      *positional_only = true;
      bVar4 = _has_remaining_positionals(this);
      if ((!bVar4) && (this->parent_ != (App *)0x0)) {
        return false;
      }
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"--","");
      _move_to_missing(this,POSITIONAL_MARK,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      break;
    case SHORT:
    case LONG:
    case WINDOWS_STYLE:
      _parse_arg(this,args,current_type);
      break;
    case SUBCOMMAND:
      bVar4 = _parse_subcommand(this,args);
      return bVar4;
    case SUBCOMMAND_TERMINATOR:
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
      pcVar2 = pbVar1[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &pbVar1[-1].field_2) {
        operator_delete(pcVar2,pbVar1[-1].field_2._M_allocated_capacity + 1);
      }
      return false;
    default:
      this_00 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"unrecognized classifier (you should not see this!)","");
      HorribleError::HorribleError(this_00,&local_40);
      __cxa_throw(this_00,&HorribleError::typeinfo,Error::~Error);
    }
    bVar4 = true;
  }
  else {
switchD_0015ab86_caseD_0:
    bVar4 = false;
    bVar3 = _parse_positional(this,args,false);
    if ((bVar3) && (bVar4 = true, this->positionals_at_end_ == true)) {
      *positional_only = true;
    }
  }
  return bVar4;
}

Assistant:

bool _parse_single(std::vector<std::string> &args, bool &positional_only) {
        bool retval = true;
        detail::Classifier classifier = positional_only ? detail::Classifier::NONE : _recognize(args.back());
        switch(classifier) {
        case detail::Classifier::POSITIONAL_MARK:
            args.pop_back();
            positional_only = true;
            if((!_has_remaining_positionals()) && (parent_ != nullptr)) {
                retval = false;
            } else {
                _move_to_missing(classifier, "--");
            }
            break;
        case detail::Classifier::SUBCOMMAND_TERMINATOR:
            // treat this like a positional mark if in the parent app
            args.pop_back();
            retval = false;
            break;
        case detail::Classifier::SUBCOMMAND:
            retval = _parse_subcommand(args);
            break;
        case detail::Classifier::LONG:
        case detail::Classifier::SHORT:
        case detail::Classifier::WINDOWS_STYLE:
            // If already parsed a subcommand, don't accept options_
            _parse_arg(args, classifier);
            break;
        case detail::Classifier::NONE:
            // Probably a positional or something for a parent (sub)command
            retval = _parse_positional(args, false);
            if(retval && positionals_at_end_) {
                positional_only = true;
            }
            break;
            // LCOV_EXCL_START
        default:
            throw HorribleError("unrecognized classifier (you should not see this!)");
            // LCOV_EXCL_STOP
        }
        return retval;
    }